

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

void secp256k1_ellswift_xswiftec_frac_var
               (secp256k1_fe *xn,secp256k1_fe *xd,secp256k1_fe *u,secp256k1_fe *t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  int iVar521;
  ulong uVar522;
  ulong uVar523;
  ulong uVar524;
  ulong uVar525;
  ulong uVar526;
  ulong uVar527;
  ulong uVar528;
  ulong uVar529;
  ulong uVar530;
  uint64_t tmp3_3;
  uint64_t tmp2_3;
  uint64_t tmp3_5;
  uint64_t tmp3_2;
  uint64_t tmp2;
  secp256k1_fe s;
  secp256k1_fe u1;
  secp256k1_fe d;
  secp256k1_fe g;
  secp256k1_fe local_198;
  secp256k1_fe local_168;
  secp256k1_fe *local_140;
  uint64_t local_138;
  uint64_t uStack_130;
  uint64_t local_128;
  uint64_t uStack_120;
  ulong local_118;
  secp256k1_fe local_108;
  ulong local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  secp256k1_fe local_a8;
  ulong local_80;
  ulong uStack_78;
  ulong local_70;
  ulong uStack_68;
  ulong local_60;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  uint64_t uStack_40;
  
  local_108.n[0] = u->n[0];
  local_108.n[1] = u->n[1];
  local_108.n[2] = u->n[2];
  local_108.n[3] = u->n[3];
  local_108.n[4] = u->n[4];
  local_140 = xd;
  iVar521 = secp256k1_fe_impl_normalizes_to_zero_var(&local_108);
  if (iVar521 != 0) {
    local_108.n[2] = 0;
    local_108.n[3] = 0;
    local_108.n[0] = 1;
    local_108.n[1] = 0;
    local_108.n[4] = 0;
  }
  uVar525 = t->n[0];
  uVar528 = t->n[1];
  uVar523 = t->n[2];
  uVar526 = t->n[3];
  uVar527 = t->n[4];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar525 * 2;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = uVar526;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar528 * 2;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = uVar523;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar527;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar527;
  uVar522 = SUB168(auVar3 * auVar273,0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar522 & 0xfffffffffffff;
  auVar1 = auVar2 * auVar272 + auVar1 * auVar271 + auVar4 * ZEXT816(0x1000003d10);
  uVar524 = auVar1._0_8_;
  local_80 = uVar524 & 0xfffffffffffff;
  auVar451._8_8_ = 0;
  auVar451._0_8_ = uVar524 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar527 = uVar527 * 2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar525;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uVar527;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar528 * 2;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uVar526;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar523;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar523;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar522 >> 0x34 | SUB168(auVar3 * auVar273,8) << 0xc;
  auVar1 = auVar5 * auVar274 + auVar451 + auVar6 * auVar275 + auVar7 * auVar276 +
           auVar8 * ZEXT816(0x1000003d10);
  local_168.n[0] = auVar1._0_8_;
  auVar452._8_8_ = 0;
  auVar452._0_8_ = local_168.n[0] >> 0x34 | auVar1._8_8_ << 0xc;
  local_a8.n[0] = (local_168.n[0] & 0xfffffffffffff) >> 0x30;
  local_168.n[0] = local_168.n[0] & 0xffffffffffff;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar525;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = uVar525;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar528;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uVar527;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar523 * 2;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = uVar526;
  auVar1 = auVar10 * auVar278 + auVar452 + auVar11 * auVar279;
  uVar522 = auVar1._0_8_;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = uVar522 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = (uVar522 & 0xfffffffffffff) << 4 | local_a8.n[0];
  auVar1 = auVar9 * auVar277 + ZEXT816(0x1000003d1) * auVar280;
  uVar522 = auVar1._0_8_;
  local_138 = uVar522 & 0xfffffffffffff;
  auVar453._8_8_ = 0;
  auVar453._0_8_ = uVar522 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar525 * 2;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar528;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar523;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar527;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar526;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = uVar526;
  auVar2 = auVar13 * auVar282 + auVar454 + auVar14 * auVar283;
  uVar522 = auVar2._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar522 & 0xfffffffffffff;
  auVar1 = auVar12 * auVar281 + auVar453 + auVar15 * ZEXT816(0x1000003d10);
  uVar524 = auVar1._0_8_;
  auVar456._8_8_ = 0;
  auVar456._0_8_ = uVar522 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_130 = uVar524 & 0xfffffffffffff;
  auVar455._8_8_ = 0;
  auVar455._0_8_ = uVar524 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar525 * 2;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar523;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar528;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uVar528;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar526;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uVar527;
  auVar456 = auVar18 * auVar286 + auVar456;
  uVar525 = auVar456._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar525 & 0xfffffffffffff;
  auVar1 = auVar16 * auVar284 + auVar455 + auVar17 * auVar285 + auVar19 * ZEXT816(0x1000003d10);
  uVar528 = auVar1._0_8_;
  local_128 = uVar528 & 0xfffffffffffff;
  auVar457._8_8_ = 0;
  auVar457._0_8_ = (uVar528 >> 0x34 | auVar1._8_8_ << 0xc) + local_80;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar525 >> 0x34 | auVar456._8_8_ << 0xc;
  auVar457 = auVar20 * ZEXT816(0x1000003d10) + auVar457;
  uVar525 = auVar457._0_8_;
  uStack_120 = uVar525 & 0xfffffffffffff;
  local_118 = (uVar525 >> 0x34 | auVar457._8_8_ << 0xc) + local_168.n[0];
  iVar521 = secp256k1_fe_impl_normalizes_to_zero_var(t);
  if (iVar521 != 0) {
    local_128 = 0;
    uStack_120 = 0;
    local_138 = 1;
    uStack_130 = 0;
    local_118 = 0;
  }
  uVar528 = local_118;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_108.n[0] * 2;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = local_108.n[3];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_108.n[1] * 2;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = local_108.n[2];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_108.n[4];
  auVar289._8_8_ = 0;
  auVar289._0_8_ = local_108.n[4];
  uVar523 = SUB168(auVar23 * auVar289,0);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar523 & 0xfffffffffffff;
  auVar1 = auVar22 * auVar288 + auVar21 * auVar287 + auVar24 * ZEXT816(0x1000003d10);
  uVar526 = auVar1._0_8_;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = uVar526 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar525 = local_108.n[4] * 2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_108.n[0];
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar525;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_108.n[1] * 2;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = local_108.n[3];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_108.n[2];
  auVar292._8_8_ = 0;
  auVar292._0_8_ = local_108.n[2];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar523 >> 0x34 | SUB168(auVar23 * auVar289,8) << 0xc;
  auVar1 = auVar25 * auVar290 + auVar458 + auVar26 * auVar291 + auVar27 * auVar292 +
           auVar28 * ZEXT816(0x1000003d10);
  uVar523 = auVar1._0_8_;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = uVar523 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_108.n[0];
  auVar293._8_8_ = 0;
  auVar293._0_8_ = local_108.n[0];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_108.n[1];
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar525;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_108.n[2] * 2;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = local_108.n[3];
  auVar1 = auVar30 * auVar294 + auVar459 + auVar31 * auVar295;
  uVar527 = auVar1._0_8_;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = uVar527 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = (uVar527 & 0xfffffffffffff) << 4 | (uVar523 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar29 * auVar293 + ZEXT816(0x1000003d1) * auVar296;
  uVar527 = auVar1._0_8_;
  local_d8 = uVar527 & 0xfffffffffffff;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = uVar527 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_108.n[0] * 2;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = local_108.n[1];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_108.n[2];
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar525;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_108.n[3];
  auVar299._8_8_ = 0;
  auVar299._0_8_ = local_108.n[3];
  auVar2 = auVar33 * auVar298 + auVar461 + auVar34 * auVar299;
  uVar527 = auVar2._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar527 & 0xfffffffffffff;
  auVar1 = auVar32 * auVar297 + auVar460 + auVar35 * ZEXT816(0x1000003d10);
  uVar522 = auVar1._0_8_;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = uVar527 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_d0 = uVar522 & 0xfffffffffffff;
  auVar462._8_8_ = 0;
  auVar462._0_8_ = uVar522 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_108.n[0] * 2;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = local_108.n[2];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_108.n[1];
  auVar301._8_8_ = 0;
  auVar301._0_8_ = local_108.n[1];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_108.n[3];
  auVar302._8_8_ = 0;
  auVar302._0_8_ = uVar525;
  auVar463 = auVar38 * auVar302 + auVar463;
  uVar525 = auVar463._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar525 & 0xfffffffffffff;
  auVar1 = auVar36 * auVar300 + auVar462 + auVar37 * auVar301 + auVar39 * ZEXT816(0x1000003d10);
  uVar527 = auVar1._0_8_;
  local_c8 = uVar527 & 0xfffffffffffff;
  auVar464._8_8_ = 0;
  auVar464._0_8_ = (uVar527 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar526 & 0xfffffffffffff);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar525 >> 0x34 | auVar463._8_8_ << 0xc;
  auVar464 = auVar40 * ZEXT816(0x1000003d10) + auVar464;
  uVar525 = auVar464._0_8_;
  uStack_c0 = uVar525 & 0xfffffffffffff;
  local_b8 = (uVar525 >> 0x34 | auVar464._8_8_ << 0xc) + (uVar523 & 0xffffffffffff);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_108.n[0];
  auVar303._8_8_ = 0;
  auVar303._0_8_ = uStack_c0;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_108.n[1];
  auVar304._8_8_ = 0;
  auVar304._0_8_ = local_c8;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_108.n[2];
  auVar305._8_8_ = 0;
  auVar305._0_8_ = uStack_d0;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_108.n[3];
  auVar306._8_8_ = 0;
  auVar306._0_8_ = local_d8;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_108.n[4];
  auVar307._8_8_ = 0;
  auVar307._0_8_ = local_b8;
  uVar525 = SUB168(auVar45 * auVar307,0);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar525 & 0xfffffffffffff;
  auVar1 = auVar42 * auVar304 + auVar41 * auVar303 + auVar43 * auVar305 + auVar44 * auVar306 +
           auVar46 * ZEXT816(0x1000003d10);
  uVar523 = auVar1._0_8_;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = uVar523 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_108.n[0];
  auVar308._8_8_ = 0;
  auVar308._0_8_ = local_b8;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_108.n[1];
  auVar309._8_8_ = 0;
  auVar309._0_8_ = uStack_c0;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_108.n[2];
  auVar310._8_8_ = 0;
  auVar310._0_8_ = local_c8;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_108.n[3];
  auVar311._8_8_ = 0;
  auVar311._0_8_ = uStack_d0;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_108.n[4];
  auVar312._8_8_ = 0;
  auVar312._0_8_ = local_d8;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar525 >> 0x34 | SUB168(auVar45 * auVar307,8) << 0xc;
  auVar1 = auVar47 * auVar308 + auVar465 + auVar48 * auVar309 + auVar49 * auVar310 +
           auVar50 * auVar311 + auVar51 * auVar312 + auVar52 * ZEXT816(0x1000003d10);
  local_a8.n[0] = auVar1._0_8_;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = local_a8.n[0] >> 0x34 | auVar1._8_8_ << 0xc;
  local_198.n[0] = (local_a8.n[0] & 0xfffffffffffff) >> 0x30;
  local_a8.n[0] = local_a8.n[0] & 0xffffffffffff;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_108.n[0];
  auVar313._8_8_ = 0;
  auVar313._0_8_ = local_d8;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_108.n[1];
  auVar314._8_8_ = 0;
  auVar314._0_8_ = local_b8;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_108.n[2];
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uStack_c0;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_108.n[3];
  auVar316._8_8_ = 0;
  auVar316._0_8_ = local_c8;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_108.n[4];
  auVar317._8_8_ = 0;
  auVar317._0_8_ = uStack_d0;
  auVar1 = auVar54 * auVar314 + auVar466 + auVar55 * auVar315 + auVar56 * auVar316 +
           auVar57 * auVar317;
  uVar525 = auVar1._0_8_;
  auVar468._8_8_ = 0;
  auVar468._0_8_ = uVar525 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = (uVar525 & 0xfffffffffffff) << 4 | local_198.n[0];
  auVar1 = auVar53 * auVar313 + ZEXT816(0x1000003d1) * auVar318;
  uVar526 = auVar1._0_8_;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = uVar526 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_108.n[0];
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uStack_d0;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = local_108.n[1];
  auVar320._8_8_ = 0;
  auVar320._0_8_ = local_d8;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_108.n[2];
  auVar321._8_8_ = 0;
  auVar321._0_8_ = local_b8;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_108.n[3];
  auVar322._8_8_ = 0;
  auVar322._0_8_ = uStack_c0;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_108.n[4];
  auVar323._8_8_ = 0;
  auVar323._0_8_ = local_c8;
  auVar2 = auVar60 * auVar321 + auVar468 + auVar61 * auVar322 + auVar62 * auVar323;
  uVar525 = auVar2._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar525 & 0xfffffffffffff;
  auVar1 = auVar58 * auVar319 + auVar467 + auVar59 * auVar320 + auVar63 * ZEXT816(0x1000003d10);
  uVar527 = auVar1._0_8_;
  auVar470._8_8_ = 0;
  auVar470._0_8_ = uVar525 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_78 = uVar527 & 0xfffffffffffff;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = uVar527 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_108.n[0];
  auVar324._8_8_ = 0;
  auVar324._0_8_ = local_c8;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_108.n[1];
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uStack_d0;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_108.n[2];
  auVar326._8_8_ = 0;
  auVar326._0_8_ = local_d8;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_108.n[3];
  auVar327._8_8_ = 0;
  auVar327._0_8_ = local_b8;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_108.n[4];
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uStack_c0;
  auVar2 = auVar67 * auVar327 + auVar470 + auVar68 * auVar328;
  uVar525 = auVar2._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar525 & 0xfffffffffffff;
  auVar1 = auVar64 * auVar324 + auVar469 + auVar65 * auVar325 + auVar66 * auVar326 +
           auVar69 * ZEXT816(0x1000003d10);
  uVar527 = auVar1._0_8_;
  local_70 = uVar527 & 0xfffffffffffff;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = (uVar527 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar523 & 0xfffffffffffff);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar525 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar471 = auVar70 * ZEXT816(0x1000003d10) + auVar471;
  uVar525 = auVar471._0_8_;
  uStack_68 = uVar525 & 0xfffffffffffff;
  local_60 = (uVar525 >> 0x34 | auVar471._8_8_ << 0xc) + local_a8.n[0];
  local_80 = (uVar526 & 0xfffffffffffff) + 7;
  local_58 = local_138;
  uStack_50 = uStack_130;
  local_168.n[0] = local_80 + local_138;
  local_168.n[1] = uStack_78 + uStack_130;
  local_48 = local_128;
  uStack_40 = uStack_120;
  local_168.n[2] = local_70 + local_128;
  local_168.n[3] = uStack_68 + uStack_120;
  local_168.n[4] = local_60 + local_118;
  iVar521 = secp256k1_fe_impl_normalizes_to_zero_var(&local_168);
  if (iVar521 != 0) {
    local_138 = local_58 * 4;
    uStack_130 = uStack_50 * 4;
    local_128 = local_48 * 4;
    uStack_120 = uStack_40 * 4;
    local_168.n[0] = local_80 + local_138;
    local_168.n[1] = uStack_78 + uStack_130;
    local_168.n[2] = local_70 + local_128;
    local_118 = uVar528 * 4;
    local_168.n[3] = uStack_68 + uStack_120;
    local_168.n[4] = local_60 + local_118;
  }
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_d8;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = uStack_120;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uStack_d0;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = local_128;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = local_c8;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uStack_130;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uStack_c0;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = local_138;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = local_b8;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = local_118;
  uVar525 = SUB168(auVar75 * auVar333,0);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar525 & 0xfffffffffffff;
  auVar1 = auVar72 * auVar330 + auVar71 * auVar329 + auVar73 * auVar331 + auVar74 * auVar332 +
           auVar76 * ZEXT816(0x1000003d10);
  uVar528 = auVar1._0_8_;
  auVar472._8_8_ = 0;
  auVar472._0_8_ = uVar528 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_d8;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = local_118;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uStack_d0;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uStack_120;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = local_c8;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = local_128;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uStack_c0;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uStack_130;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = local_b8;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = local_138;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar525 >> 0x34 | SUB168(auVar75 * auVar333,8) << 0xc;
  auVar1 = auVar77 * auVar334 + auVar472 + auVar78 * auVar335 + auVar79 * auVar336 +
           auVar80 * auVar337 + auVar81 * auVar338 + auVar82 * ZEXT816(0x1000003d10);
  uVar525 = auVar1._0_8_;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = uVar525 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = local_d8;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = local_138;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uStack_d0;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = local_118;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = local_c8;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uStack_120;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uStack_c0;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = local_128;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = local_b8;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = uStack_130;
  auVar1 = auVar84 * auVar340 + auVar473 + auVar85 * auVar341 + auVar86 * auVar342 +
           auVar87 * auVar343;
  uVar523 = auVar1._0_8_;
  auVar475._8_8_ = 0;
  auVar475._0_8_ = uVar523 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = (uVar523 & 0xfffffffffffff) << 4 | (uVar525 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar83 * auVar339 + ZEXT816(0x1000003d1) * auVar344;
  uVar526 = auVar1._0_8_;
  auVar474._8_8_ = 0;
  auVar474._0_8_ = uVar526 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = local_d8;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uStack_130;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uStack_d0;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = local_138;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = local_c8;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = local_118;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uStack_c0;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = uStack_120;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = local_b8;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = local_128;
  auVar2 = auVar90 * auVar347 + auVar475 + auVar91 * auVar348 + auVar92 * auVar349;
  uVar523 = auVar2._0_8_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar523 & 0xfffffffffffff;
  auVar1 = auVar88 * auVar345 + auVar474 + auVar89 * auVar346 + auVar93 * ZEXT816(0x1000003d10);
  uVar527 = auVar1._0_8_;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = uVar523 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar476._8_8_ = 0;
  auVar476._0_8_ = uVar527 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = local_d8;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = local_128;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uStack_d0;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = uStack_130;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = local_c8;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = local_138;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uStack_c0;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = local_118;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = local_b8;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = uStack_120;
  auVar2 = auVar97 * auVar353 + auVar477 + auVar98 * auVar354;
  uVar523 = auVar2._0_8_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar523 & 0xfffffffffffff;
  auVar1 = auVar94 * auVar350 + auVar476 + auVar95 * auVar351 + auVar96 * auVar352 +
           auVar99 * ZEXT816(0x1000003d10);
  uVar522 = auVar1._0_8_;
  auVar478._8_8_ = 0;
  auVar478._0_8_ = (uVar522 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar528 & 0xfffffffffffff);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar523 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar478 = auVar100 * ZEXT816(0x1000003d10) + auVar478;
  uVar528 = auVar478._0_8_;
  local_a8.n[0] = (uVar526 & 0xfffffffffffff) * 3;
  local_a8.n[1] = (uVar527 & 0xfffffffffffff) * 3;
  local_a8.n[2] = (uVar522 & 0xfffffffffffff) * 3;
  local_a8.n[3] = (uVar528 & 0xfffffffffffff) * 3;
  local_a8.n[4] = ((uVar528 >> 0x34 | auVar478._8_8_ << 0xc) + (uVar525 & 0xffffffffffff)) * 3;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = local_168.n[0] * 2;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = local_168.n[3];
  auVar102._8_8_ = 0;
  auVar102._0_8_ = local_168.n[1] * 2;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = local_168.n[2];
  auVar103._8_8_ = 0;
  auVar103._0_8_ = local_168.n[4];
  auVar357._8_8_ = 0;
  auVar357._0_8_ = local_168.n[4];
  uVar528 = SUB168(auVar103 * auVar357,0);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar528 & 0xfffffffffffff;
  auVar1 = auVar102 * auVar356 + auVar101 * auVar355 + auVar104 * ZEXT816(0x1000003d10);
  uVar523 = auVar1._0_8_;
  auVar479._8_8_ = 0;
  auVar479._0_8_ = uVar523 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar525 = local_168.n[4] * 2;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = local_168.n[0];
  auVar358._8_8_ = 0;
  auVar358._0_8_ = uVar525;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = local_168.n[1] * 2;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = local_168.n[3];
  auVar107._8_8_ = 0;
  auVar107._0_8_ = local_168.n[2];
  auVar360._8_8_ = 0;
  auVar360._0_8_ = local_168.n[2];
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar528 >> 0x34 | SUB168(auVar103 * auVar357,8) << 0xc;
  auVar1 = auVar105 * auVar358 + auVar479 + auVar106 * auVar359 + auVar107 * auVar360 +
           auVar108 * ZEXT816(0x1000003d10);
  uVar528 = auVar1._0_8_;
  auVar480._8_8_ = 0;
  auVar480._0_8_ = uVar528 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = local_168.n[0];
  auVar361._8_8_ = 0;
  auVar361._0_8_ = local_168.n[0];
  auVar110._8_8_ = 0;
  auVar110._0_8_ = local_168.n[1];
  auVar362._8_8_ = 0;
  auVar362._0_8_ = uVar525;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = local_168.n[2] * 2;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = local_168.n[3];
  auVar1 = auVar110 * auVar362 + auVar480 + auVar111 * auVar363;
  uVar526 = auVar1._0_8_;
  auVar482._8_8_ = 0;
  auVar482._0_8_ = uVar526 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = (uVar526 & 0xfffffffffffff) << 4 | (uVar528 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar109 * auVar361 + ZEXT816(0x1000003d1) * auVar364;
  uVar527 = auVar1._0_8_;
  auVar481._8_8_ = 0;
  auVar481._0_8_ = uVar527 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = local_168.n[0] * 2;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = local_168.n[1];
  auVar113._8_8_ = 0;
  auVar113._0_8_ = local_168.n[2];
  auVar366._8_8_ = 0;
  auVar366._0_8_ = uVar525;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = local_168.n[3];
  auVar367._8_8_ = 0;
  auVar367._0_8_ = local_168.n[3];
  auVar2 = auVar113 * auVar366 + auVar482 + auVar114 * auVar367;
  uVar526 = auVar2._0_8_;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar526 & 0xfffffffffffff;
  auVar1 = auVar112 * auVar365 + auVar481 + auVar115 * ZEXT816(0x1000003d10);
  uVar522 = auVar1._0_8_;
  auVar484._8_8_ = 0;
  auVar484._0_8_ = uVar526 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar483._8_8_ = 0;
  auVar483._0_8_ = uVar522 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = local_168.n[0] * 2;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = local_168.n[2];
  auVar117._8_8_ = 0;
  auVar117._0_8_ = local_168.n[1];
  auVar369._8_8_ = 0;
  auVar369._0_8_ = local_168.n[1];
  auVar118._8_8_ = 0;
  auVar118._0_8_ = local_168.n[3];
  auVar370._8_8_ = 0;
  auVar370._0_8_ = uVar525;
  auVar484 = auVar118 * auVar370 + auVar484;
  uVar525 = auVar484._0_8_;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar525 & 0xfffffffffffff;
  auVar1 = auVar116 * auVar368 + auVar483 + auVar117 * auVar369 + auVar119 * ZEXT816(0x1000003d10);
  uVar526 = auVar1._0_8_;
  auVar485._8_8_ = 0;
  auVar485._0_8_ = (uVar526 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar523 & 0xfffffffffffff);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar525 >> 0x34 | auVar484._8_8_ << 0xc;
  auVar485 = auVar120 * ZEXT816(0x1000003d10) + auVar485;
  uVar525 = auVar485._0_8_;
  local_d8 = 0x3ffffbfffff0bc - (uVar527 & 0xfffffffffffff);
  uStack_d0 = 0x3ffffffffffffc - (uVar522 & 0xfffffffffffff);
  local_c8 = 0x3ffffffffffffc - (uVar526 & 0xfffffffffffff);
  uStack_c0 = 0x3ffffffffffffc - (uVar525 & 0xfffffffffffff);
  local_b8 = 0x3fffffffffffc -
             ((uVar525 >> 0x34 | auVar485._8_8_ << 0xc) + (uVar528 & 0xffffffffffff));
  auVar121._8_8_ = 0;
  auVar121._0_8_ = local_108.n[0];
  auVar371._8_8_ = 0;
  auVar371._0_8_ = local_a8.n[3];
  auVar122._8_8_ = 0;
  auVar122._0_8_ = local_108.n[1];
  auVar372._8_8_ = 0;
  auVar372._0_8_ = local_a8.n[2];
  auVar123._8_8_ = 0;
  auVar123._0_8_ = local_108.n[2];
  auVar373._8_8_ = 0;
  auVar373._0_8_ = local_a8.n[1];
  auVar124._8_8_ = 0;
  auVar124._0_8_ = local_108.n[3];
  auVar374._8_8_ = 0;
  auVar374._0_8_ = local_a8.n[0];
  auVar125._8_8_ = 0;
  auVar125._0_8_ = local_108.n[4];
  auVar375._8_8_ = 0;
  auVar375._0_8_ = local_a8.n[4];
  uVar525 = SUB168(auVar125 * auVar375,0);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar525 & 0xfffffffffffff;
  auVar1 = auVar122 * auVar372 + auVar121 * auVar371 + auVar123 * auVar373 + auVar124 * auVar374 +
           auVar126 * ZEXT816(0x1000003d10);
  uVar528 = auVar1._0_8_;
  auVar486._8_8_ = 0;
  auVar486._0_8_ = uVar528 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = local_108.n[0];
  auVar376._8_8_ = 0;
  auVar376._0_8_ = local_a8.n[4];
  auVar128._8_8_ = 0;
  auVar128._0_8_ = local_108.n[1];
  auVar377._8_8_ = 0;
  auVar377._0_8_ = local_a8.n[3];
  auVar129._8_8_ = 0;
  auVar129._0_8_ = local_108.n[2];
  auVar378._8_8_ = 0;
  auVar378._0_8_ = local_a8.n[2];
  auVar130._8_8_ = 0;
  auVar130._0_8_ = local_108.n[3];
  auVar379._8_8_ = 0;
  auVar379._0_8_ = local_a8.n[1];
  auVar131._8_8_ = 0;
  auVar131._0_8_ = local_108.n[4];
  auVar380._8_8_ = 0;
  auVar380._0_8_ = local_a8.n[0];
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar525 >> 0x34 | SUB168(auVar125 * auVar375,8) << 0xc;
  auVar1 = auVar127 * auVar376 + auVar486 + auVar128 * auVar377 + auVar129 * auVar378 +
           auVar130 * auVar379 + auVar131 * auVar380 + auVar132 * ZEXT816(0x1000003d10);
  uVar525 = auVar1._0_8_;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = uVar525 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = local_108.n[0];
  auVar381._8_8_ = 0;
  auVar381._0_8_ = local_a8.n[0];
  auVar134._8_8_ = 0;
  auVar134._0_8_ = local_108.n[1];
  auVar382._8_8_ = 0;
  auVar382._0_8_ = local_a8.n[4];
  auVar135._8_8_ = 0;
  auVar135._0_8_ = local_108.n[2];
  auVar383._8_8_ = 0;
  auVar383._0_8_ = local_a8.n[3];
  auVar136._8_8_ = 0;
  auVar136._0_8_ = local_108.n[3];
  auVar384._8_8_ = 0;
  auVar384._0_8_ = local_a8.n[2];
  auVar137._8_8_ = 0;
  auVar137._0_8_ = local_108.n[4];
  auVar385._8_8_ = 0;
  auVar385._0_8_ = local_a8.n[1];
  auVar1 = auVar134 * auVar382 + auVar487 + auVar135 * auVar383 + auVar136 * auVar384 +
           auVar137 * auVar385;
  uVar523 = auVar1._0_8_;
  auVar489._8_8_ = 0;
  auVar489._0_8_ = uVar523 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar386._8_8_ = 0;
  auVar386._0_8_ = (uVar523 & 0xfffffffffffff) << 4 | (uVar525 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar133 * auVar381 + ZEXT816(0x1000003d1) * auVar386;
  uVar526 = auVar1._0_8_;
  auVar488._8_8_ = 0;
  auVar488._0_8_ = uVar526 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = local_108.n[0];
  auVar387._8_8_ = 0;
  auVar387._0_8_ = local_a8.n[1];
  auVar139._8_8_ = 0;
  auVar139._0_8_ = local_108.n[1];
  auVar388._8_8_ = 0;
  auVar388._0_8_ = local_a8.n[0];
  auVar140._8_8_ = 0;
  auVar140._0_8_ = local_108.n[2];
  auVar389._8_8_ = 0;
  auVar389._0_8_ = local_a8.n[4];
  auVar141._8_8_ = 0;
  auVar141._0_8_ = local_108.n[3];
  auVar390._8_8_ = 0;
  auVar390._0_8_ = local_a8.n[3];
  auVar142._8_8_ = 0;
  auVar142._0_8_ = local_108.n[4];
  auVar391._8_8_ = 0;
  auVar391._0_8_ = local_a8.n[2];
  auVar2 = auVar140 * auVar389 + auVar489 + auVar141 * auVar390 + auVar142 * auVar391;
  uVar523 = auVar2._0_8_;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar523 & 0xfffffffffffff;
  auVar1 = auVar138 * auVar387 + auVar488 + auVar139 * auVar388 + auVar143 * ZEXT816(0x1000003d10);
  uVar527 = auVar1._0_8_;
  auVar491._8_8_ = 0;
  auVar491._0_8_ = uVar523 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar490._8_8_ = 0;
  auVar490._0_8_ = uVar527 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = local_108.n[0];
  auVar392._8_8_ = 0;
  auVar392._0_8_ = local_a8.n[2];
  auVar145._8_8_ = 0;
  auVar145._0_8_ = local_108.n[1];
  auVar393._8_8_ = 0;
  auVar393._0_8_ = local_a8.n[1];
  auVar146._8_8_ = 0;
  auVar146._0_8_ = local_108.n[2];
  auVar394._8_8_ = 0;
  auVar394._0_8_ = local_a8.n[0];
  auVar147._8_8_ = 0;
  auVar147._0_8_ = local_108.n[3];
  auVar395._8_8_ = 0;
  auVar395._0_8_ = local_a8.n[4];
  auVar148._8_8_ = 0;
  auVar148._0_8_ = local_108.n[4];
  auVar396._8_8_ = 0;
  auVar396._0_8_ = local_a8.n[3];
  auVar2 = auVar147 * auVar395 + auVar491 + auVar148 * auVar396;
  uVar523 = auVar2._0_8_;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar523 & 0xfffffffffffff;
  auVar1 = auVar144 * auVar392 + auVar490 + auVar145 * auVar393 + auVar146 * auVar394 +
           auVar149 * ZEXT816(0x1000003d10);
  uVar522 = auVar1._0_8_;
  auVar492._8_8_ = 0;
  auVar492._0_8_ = (uVar522 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar528 & 0xfffffffffffff);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar523 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar492 = auVar150 * ZEXT816(0x1000003d10) + auVar492;
  uVar528 = auVar492._0_8_;
  local_198.n[0] = (uVar526 & 0xfffffffffffff) + local_d8;
  local_198.n[1] = (uVar527 & 0xfffffffffffff) + uStack_d0;
  local_198.n[2] = (uVar522 & 0xfffffffffffff) + local_c8;
  local_198.n[3] = (uVar528 & 0xfffffffffffff) + uStack_c0;
  local_198.n[4] = (uVar528 >> 0x34 | auVar492._8_8_ << 0xc) + (uVar525 & 0xffffffffffff) + local_b8
  ;
  iVar521 = secp256k1_ge_x_frac_on_curve_var(&local_198,&local_a8);
  if (iVar521 == 0) {
    local_140->n[4] = local_168.n[4];
    local_140->n[2] = local_168.n[2];
    local_140->n[3] = local_168.n[3];
    local_140->n[0] = local_168.n[0];
    local_140->n[1] = local_168.n[1];
    auVar151._8_8_ = 0;
    auVar151._0_8_ = local_138;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uStack_130;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = local_128;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uStack_120;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = local_118;
    uVar525 = SUB168(auVar155 * ZEXT816(0x851695d49a83),0);
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar525 & 0xfffffffffffff;
    auVar1 = auVar152 * ZEXT816(0x3cbcb16630fb6) + auVar151 * ZEXT816(0xf8ef919bb8615) +
             auVar153 * ZEXT816(0x8aed0a766a3ec) + auVar154 * ZEXT816(0x693d68e6afa40) +
             auVar156 * ZEXT816(0x1000003d10);
    uVar528 = auVar1._0_8_;
    auVar493._8_8_ = 0;
    auVar493._0_8_ = uVar528 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = local_138;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uStack_130;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = local_128;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uStack_120;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = local_118;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar525 >> 0x34 | SUB168(auVar155 * ZEXT816(0x851695d49a83),8) << 0xc;
    auVar1 = auVar157 * ZEXT816(0x851695d49a83) + auVar493 + auVar158 * ZEXT816(0xf8ef919bb8615) +
             auVar159 * ZEXT816(0x3cbcb16630fb6) + auVar160 * ZEXT816(0x8aed0a766a3ec) +
             auVar161 * ZEXT816(0x693d68e6afa40) + auVar162 * ZEXT816(0x1000003d10);
    uVar525 = auVar1._0_8_;
    auVar494._8_8_ = 0;
    auVar494._0_8_ = uVar525 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = local_138;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uStack_130;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = local_128;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uStack_120;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = local_118;
    auVar1 = auVar164 * ZEXT816(0x851695d49a83) + auVar494 + auVar165 * ZEXT816(0xf8ef919bb8615) +
             auVar166 * ZEXT816(0x3cbcb16630fb6) + auVar167 * ZEXT816(0x8aed0a766a3ec);
    uVar523 = auVar1._0_8_;
    auVar496._8_8_ = 0;
    auVar496._0_8_ = uVar523 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar397._8_8_ = 0;
    auVar397._0_8_ = (uVar523 & 0xfffffffffffff) << 4 | (uVar525 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar163 * ZEXT816(0x693d68e6afa40) + ZEXT816(0x1000003d1) * auVar397;
    uVar523 = auVar1._0_8_;
    local_d8 = uVar523 & 0xfffffffffffff;
    auVar495._8_8_ = 0;
    auVar495._0_8_ = uVar523 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = local_138;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uStack_130;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = local_128;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uStack_120;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = local_118;
    auVar2 = auVar170 * ZEXT816(0x851695d49a83) + auVar496 + auVar171 * ZEXT816(0xf8ef919bb8615) +
             auVar172 * ZEXT816(0x3cbcb16630fb6);
    uVar523 = auVar2._0_8_;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar523 & 0xfffffffffffff;
    auVar1 = auVar168 * ZEXT816(0x8aed0a766a3ec) + auVar495 + auVar169 * ZEXT816(0x693d68e6afa40) +
             auVar173 * ZEXT816(0x1000003d10);
    uVar526 = auVar1._0_8_;
    auVar498._8_8_ = 0;
    auVar498._0_8_ = uVar523 >> 0x34 | auVar2._8_8_ << 0xc;
    uStack_d0 = uVar526 & 0xfffffffffffff;
    auVar497._8_8_ = 0;
    auVar497._0_8_ = uVar526 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = local_138;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uStack_130;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = local_128;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = uStack_120;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = local_118;
    auVar2 = auVar177 * ZEXT816(0x851695d49a83) + auVar498 + auVar178 * ZEXT816(0xf8ef919bb8615);
    uVar523 = auVar2._0_8_;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar523 & 0xfffffffffffff;
    auVar1 = auVar174 * ZEXT816(0x3cbcb16630fb6) + auVar497 + auVar175 * ZEXT816(0x8aed0a766a3ec) +
             auVar176 * ZEXT816(0x693d68e6afa40) + auVar179 * ZEXT816(0x1000003d10);
    uVar526 = auVar1._0_8_;
    local_c8 = uVar526 & 0xfffffffffffff;
    auVar499._8_8_ = 0;
    auVar499._0_8_ = (uVar526 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar528 & 0xfffffffffffff);
    auVar180._8_8_ = 0;
    auVar180._0_8_ = uVar523 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar499 = auVar180 * ZEXT816(0x1000003d10) + auVar499;
    uVar528 = auVar499._0_8_;
    uStack_c0 = uVar528 & 0xfffffffffffff;
    local_b8 = (uVar528 >> 0x34 | auVar499._8_8_ << 0xc) + (uVar525 & 0xffffffffffff);
    auVar181._8_8_ = 0;
    auVar181._0_8_ = local_80;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = uStack_78;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = local_70;
    auVar184._8_8_ = 0;
    auVar184._0_8_ = uStack_68;
    auVar185._8_8_ = 0;
    auVar185._0_8_ = local_60;
    uVar525 = SUB168(auVar185 * ZEXT816(0x7ae96a2b657c),0);
    auVar186._8_8_ = 0;
    auVar186._0_8_ = uVar525 & 0xfffffffffffff;
    auVar1 = auVar182 * ZEXT816(0xc3434e99cf049) + auVar181 * ZEXT816(0x7106e64479ea) +
             auVar183 * ZEXT816(0x7512f58995c13) + auVar184 * ZEXT816(0x96c28719501ee) +
             auVar186 * ZEXT816(0x1000003d10);
    uVar528 = auVar1._0_8_;
    auVar500._8_8_ = 0;
    auVar500._0_8_ = uVar528 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = local_80;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = uStack_78;
    auVar189._8_8_ = 0;
    auVar189._0_8_ = local_70;
    auVar190._8_8_ = 0;
    auVar190._0_8_ = uStack_68;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = local_60;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar525 >> 0x34 | SUB168(auVar185 * ZEXT816(0x7ae96a2b657c),8) << 0xc;
    auVar1 = auVar187 * ZEXT816(0x7ae96a2b657c) + auVar500 + auVar188 * ZEXT816(0x7106e64479ea) +
             auVar189 * ZEXT816(0xc3434e99cf049) + auVar190 * ZEXT816(0x7512f58995c13) +
             auVar191 * ZEXT816(0x96c28719501ee) + auVar192 * ZEXT816(0x1000003d10);
    uVar525 = auVar1._0_8_;
    auVar501._8_8_ = 0;
    auVar501._0_8_ = uVar525 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = local_80;
    auVar194._8_8_ = 0;
    auVar194._0_8_ = uStack_78;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = local_70;
    auVar196._8_8_ = 0;
    auVar196._0_8_ = uStack_68;
    auVar197._8_8_ = 0;
    auVar197._0_8_ = local_60;
    auVar1 = auVar194 * ZEXT816(0x7ae96a2b657c) + auVar501 + auVar195 * ZEXT816(0x7106e64479ea) +
             auVar196 * ZEXT816(0xc3434e99cf049) + auVar197 * ZEXT816(0x7512f58995c13);
    uVar523 = auVar1._0_8_;
    auVar503._8_8_ = 0;
    auVar503._0_8_ = uVar523 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar398._8_8_ = 0;
    auVar398._0_8_ = (uVar523 & 0xfffffffffffff) << 4 | (uVar525 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar193 * ZEXT816(0x96c28719501ee) + ZEXT816(0x1000003d1) * auVar398;
    uVar526 = auVar1._0_8_;
    auVar502._8_8_ = 0;
    auVar502._0_8_ = uVar526 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = local_80;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = uStack_78;
    auVar200._8_8_ = 0;
    auVar200._0_8_ = local_70;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = uStack_68;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = local_60;
    auVar2 = auVar200 * ZEXT816(0x7ae96a2b657c) + auVar503 + auVar201 * ZEXT816(0x7106e64479ea) +
             auVar202 * ZEXT816(0xc3434e99cf049);
    uVar523 = auVar2._0_8_;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = uVar523 & 0xfffffffffffff;
    auVar1 = auVar198 * ZEXT816(0x7512f58995c13) + auVar502 + auVar199 * ZEXT816(0x96c28719501ee) +
             auVar203 * ZEXT816(0x1000003d10);
    uVar527 = auVar1._0_8_;
    auVar505._8_8_ = 0;
    auVar505._0_8_ = uVar523 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar504._8_8_ = 0;
    auVar504._0_8_ = uVar527 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar204._8_8_ = 0;
    auVar204._0_8_ = local_80;
    auVar205._8_8_ = 0;
    auVar205._0_8_ = uStack_78;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = local_70;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = uStack_68;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = local_60;
    auVar2 = auVar207 * ZEXT816(0x7ae96a2b657c) + auVar505 + auVar208 * ZEXT816(0x7106e64479ea);
    uVar523 = auVar2._0_8_;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = uVar523 & 0xfffffffffffff;
    auVar1 = auVar204 * ZEXT816(0xc3434e99cf049) + auVar504 + auVar205 * ZEXT816(0x7512f58995c13) +
             auVar206 * ZEXT816(0x96c28719501ee) + auVar209 * ZEXT816(0x1000003d10);
    uVar522 = auVar1._0_8_;
    auVar506._8_8_ = 0;
    auVar506._0_8_ = (uVar522 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar528 & 0xfffffffffffff);
    auVar210._8_8_ = 0;
    auVar210._0_8_ = uVar523 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar506 = auVar210 * ZEXT816(0x1000003d10) + auVar506;
    uVar528 = auVar506._0_8_;
    uVar524 = (uVar526 & 0xfffffffffffff) + local_d8;
    uVar529 = (uVar527 & 0xfffffffffffff) + uStack_d0;
    uVar522 = (uVar522 & 0xfffffffffffff) + local_c8;
    uVar530 = (uVar528 & 0xfffffffffffff) + uStack_c0;
    uVar525 = (uVar528 >> 0x34 | auVar506._8_8_ << 0xc) + (uVar525 & 0xffffffffffff) + local_b8;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = local_108.n[0];
    auVar399._8_8_ = 0;
    auVar399._0_8_ = uVar530;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = local_108.n[1];
    auVar400._8_8_ = 0;
    auVar400._0_8_ = uVar522;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = local_108.n[2];
    auVar401._8_8_ = 0;
    auVar401._0_8_ = uVar529;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = local_108.n[3];
    auVar402._8_8_ = 0;
    auVar402._0_8_ = uVar524;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = local_108.n[4];
    auVar403._8_8_ = 0;
    auVar403._0_8_ = uVar525;
    uVar528 = SUB168(auVar215 * auVar403,0);
    auVar216._8_8_ = 0;
    auVar216._0_8_ = uVar528 & 0xfffffffffffff;
    auVar1 = auVar212 * auVar400 + auVar211 * auVar399 + auVar213 * auVar401 + auVar214 * auVar402 +
             auVar216 * ZEXT816(0x1000003d10);
    uVar523 = auVar1._0_8_;
    auVar507._8_8_ = 0;
    auVar507._0_8_ = uVar523 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar217._8_8_ = 0;
    auVar217._0_8_ = local_108.n[0];
    auVar404._8_8_ = 0;
    auVar404._0_8_ = uVar525;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = local_108.n[1];
    auVar405._8_8_ = 0;
    auVar405._0_8_ = uVar530;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = local_108.n[2];
    auVar406._8_8_ = 0;
    auVar406._0_8_ = uVar522;
    auVar220._8_8_ = 0;
    auVar220._0_8_ = local_108.n[3];
    auVar407._8_8_ = 0;
    auVar407._0_8_ = uVar529;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = local_108.n[4];
    auVar408._8_8_ = 0;
    auVar408._0_8_ = uVar524;
    auVar222._8_8_ = 0;
    auVar222._0_8_ = uVar528 >> 0x34 | SUB168(auVar215 * auVar403,8) << 0xc;
    auVar1 = auVar217 * auVar404 + auVar507 + auVar218 * auVar405 + auVar219 * auVar406 +
             auVar220 * auVar407 + auVar221 * auVar408 + auVar222 * ZEXT816(0x1000003d10);
    uVar528 = auVar1._0_8_;
    auVar508._8_8_ = 0;
    auVar508._0_8_ = uVar528 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = local_108.n[0];
    auVar409._8_8_ = 0;
    auVar409._0_8_ = uVar524;
    auVar224._8_8_ = 0;
    auVar224._0_8_ = local_108.n[1];
    auVar410._8_8_ = 0;
    auVar410._0_8_ = uVar525;
    auVar225._8_8_ = 0;
    auVar225._0_8_ = local_108.n[2];
    auVar411._8_8_ = 0;
    auVar411._0_8_ = uVar530;
    auVar226._8_8_ = 0;
    auVar226._0_8_ = local_108.n[3];
    auVar412._8_8_ = 0;
    auVar412._0_8_ = uVar522;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = local_108.n[4];
    auVar413._8_8_ = 0;
    auVar413._0_8_ = uVar529;
    auVar1 = auVar224 * auVar410 + auVar508 + auVar225 * auVar411 + auVar226 * auVar412 +
             auVar227 * auVar413;
    uVar526 = auVar1._0_8_;
    auVar510._8_8_ = 0;
    auVar510._0_8_ = uVar526 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar414._8_8_ = 0;
    auVar414._0_8_ = (uVar526 & 0xfffffffffffff) << 4 | (uVar528 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar223 * auVar409 + ZEXT816(0x1000003d1) * auVar414;
    uVar526 = auVar1._0_8_;
    local_198.n[0] = uVar526 & 0xfffffffffffff;
    auVar509._8_8_ = 0;
    auVar509._0_8_ = uVar526 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = local_108.n[0];
    auVar415._8_8_ = 0;
    auVar415._0_8_ = uVar529;
    auVar229._8_8_ = 0;
    auVar229._0_8_ = local_108.n[1];
    auVar416._8_8_ = 0;
    auVar416._0_8_ = uVar524;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = local_108.n[2];
    auVar417._8_8_ = 0;
    auVar417._0_8_ = uVar525;
    auVar231._8_8_ = 0;
    auVar231._0_8_ = local_108.n[3];
    auVar418._8_8_ = 0;
    auVar418._0_8_ = uVar530;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = local_108.n[4];
    auVar419._8_8_ = 0;
    auVar419._0_8_ = uVar522;
    auVar2 = auVar230 * auVar417 + auVar510 + auVar231 * auVar418 + auVar232 * auVar419;
    uVar526 = auVar2._0_8_;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = uVar526 & 0xfffffffffffff;
    auVar1 = auVar228 * auVar415 + auVar509 + auVar229 * auVar416 + auVar233 * ZEXT816(0x1000003d10)
    ;
    uVar527 = auVar1._0_8_;
    auVar512._8_8_ = 0;
    auVar512._0_8_ = uVar526 >> 0x34 | auVar2._8_8_ << 0xc;
    local_198.n[1] = uVar527 & 0xfffffffffffff;
    auVar511._8_8_ = 0;
    auVar511._0_8_ = uVar527 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = local_108.n[0];
    auVar420._8_8_ = 0;
    auVar420._0_8_ = uVar522;
    auVar235._8_8_ = 0;
    auVar235._0_8_ = local_108.n[1];
    auVar421._8_8_ = 0;
    auVar421._0_8_ = uVar529;
    auVar236._8_8_ = 0;
    auVar236._0_8_ = local_108.n[2];
    auVar422._8_8_ = 0;
    auVar422._0_8_ = uVar524;
    auVar237._8_8_ = 0;
    auVar237._0_8_ = local_108.n[3];
    auVar423._8_8_ = 0;
    auVar423._0_8_ = uVar525;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = local_108.n[4];
    auVar424._8_8_ = 0;
    auVar424._0_8_ = uVar530;
    auVar2 = auVar237 * auVar423 + auVar512 + auVar238 * auVar424;
    uVar525 = auVar2._0_8_;
    auVar239._8_8_ = 0;
    auVar239._0_8_ = uVar525 & 0xfffffffffffff;
    auVar1 = auVar234 * auVar420 + auVar511 + auVar235 * auVar421 + auVar236 * auVar422 +
             auVar239 * ZEXT816(0x1000003d10);
    uVar526 = auVar1._0_8_;
    local_198.n[2] = uVar526 & 0xfffffffffffff;
    auVar513._8_8_ = 0;
    auVar513._0_8_ = (uVar526 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar523 & 0xfffffffffffff);
    auVar240._8_8_ = 0;
    auVar240._0_8_ = uVar525 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar513 = auVar240 * ZEXT816(0x1000003d10) + auVar513;
    uVar525 = auVar513._0_8_;
    local_198.n[3] = uVar525 & 0xfffffffffffff;
    local_198.n[4] = (uVar525 >> 0x34 | auVar513._8_8_ << 0xc) + (uVar528 & 0xffffffffffff);
    iVar521 = secp256k1_ge_x_frac_on_curve_var(&local_198,&local_168);
    if (iVar521 == 0) {
      auVar241._8_8_ = 0;
      auVar241._0_8_ = local_108.n[0];
      auVar425._8_8_ = 0;
      auVar425._0_8_ = local_168.n[3];
      auVar242._8_8_ = 0;
      auVar242._0_8_ = local_108.n[1];
      auVar426._8_8_ = 0;
      auVar426._0_8_ = local_168.n[2];
      auVar243._8_8_ = 0;
      auVar243._0_8_ = local_108.n[2];
      auVar427._8_8_ = 0;
      auVar427._0_8_ = local_168.n[1];
      auVar244._8_8_ = 0;
      auVar244._0_8_ = local_108.n[3];
      auVar428._8_8_ = 0;
      auVar428._0_8_ = local_168.n[0];
      auVar245._8_8_ = 0;
      auVar245._0_8_ = local_108.n[4];
      auVar429._8_8_ = 0;
      auVar429._0_8_ = local_168.n[4];
      uVar525 = SUB168(auVar245 * auVar429,0);
      auVar246._8_8_ = 0;
      auVar246._0_8_ = uVar525 & 0xfffffffffffff;
      auVar1 = auVar242 * auVar426 + auVar241 * auVar425 + auVar243 * auVar427 + auVar244 * auVar428
               + auVar246 * ZEXT816(0x1000003d10);
      uVar528 = auVar1._0_8_;
      auVar514._8_8_ = 0;
      auVar514._0_8_ = uVar528 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar247._8_8_ = 0;
      auVar247._0_8_ = local_108.n[0];
      auVar430._8_8_ = 0;
      auVar430._0_8_ = local_168.n[4];
      auVar248._8_8_ = 0;
      auVar248._0_8_ = local_108.n[1];
      auVar431._8_8_ = 0;
      auVar431._0_8_ = local_168.n[3];
      auVar249._8_8_ = 0;
      auVar249._0_8_ = local_108.n[2];
      auVar432._8_8_ = 0;
      auVar432._0_8_ = local_168.n[2];
      auVar250._8_8_ = 0;
      auVar250._0_8_ = local_108.n[3];
      auVar433._8_8_ = 0;
      auVar433._0_8_ = local_168.n[1];
      auVar251._8_8_ = 0;
      auVar251._0_8_ = local_108.n[4];
      auVar434._8_8_ = 0;
      auVar434._0_8_ = local_168.n[0];
      auVar252._8_8_ = 0;
      auVar252._0_8_ = uVar525 >> 0x34 | SUB168(auVar245 * auVar429,8) << 0xc;
      auVar1 = auVar247 * auVar430 + auVar514 + auVar248 * auVar431 + auVar249 * auVar432 +
               auVar250 * auVar433 + auVar251 * auVar434 + auVar252 * ZEXT816(0x1000003d10);
      uVar525 = auVar1._0_8_;
      auVar515._8_8_ = 0;
      auVar515._0_8_ = uVar525 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar253._8_8_ = 0;
      auVar253._0_8_ = local_108.n[0];
      auVar435._8_8_ = 0;
      auVar435._0_8_ = local_168.n[0];
      auVar254._8_8_ = 0;
      auVar254._0_8_ = local_108.n[1];
      auVar436._8_8_ = 0;
      auVar436._0_8_ = local_168.n[4];
      auVar255._8_8_ = 0;
      auVar255._0_8_ = local_108.n[2];
      auVar437._8_8_ = 0;
      auVar437._0_8_ = local_168.n[3];
      auVar256._8_8_ = 0;
      auVar256._0_8_ = local_108.n[3];
      auVar438._8_8_ = 0;
      auVar438._0_8_ = local_168.n[2];
      auVar257._8_8_ = 0;
      auVar257._0_8_ = local_108.n[4];
      auVar439._8_8_ = 0;
      auVar439._0_8_ = local_168.n[1];
      auVar1 = auVar254 * auVar436 + auVar515 + auVar255 * auVar437 + auVar256 * auVar438 +
               auVar257 * auVar439;
      uVar523 = auVar1._0_8_;
      auVar517._8_8_ = 0;
      auVar517._0_8_ = uVar523 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar440._8_8_ = 0;
      auVar440._0_8_ = (uVar523 & 0xfffffffffffff) << 4 | (uVar525 & 0xfffffffffffff) >> 0x30;
      auVar1 = auVar253 * auVar435 + ZEXT816(0x1000003d1) * auVar440;
      uVar526 = auVar1._0_8_;
      auVar516._8_8_ = 0;
      auVar516._0_8_ = uVar526 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar258._8_8_ = 0;
      auVar258._0_8_ = local_108.n[0];
      auVar441._8_8_ = 0;
      auVar441._0_8_ = local_168.n[1];
      auVar259._8_8_ = 0;
      auVar259._0_8_ = local_108.n[1];
      auVar442._8_8_ = 0;
      auVar442._0_8_ = local_168.n[0];
      auVar260._8_8_ = 0;
      auVar260._0_8_ = local_108.n[2];
      auVar443._8_8_ = 0;
      auVar443._0_8_ = local_168.n[4];
      auVar261._8_8_ = 0;
      auVar261._0_8_ = local_108.n[3];
      auVar444._8_8_ = 0;
      auVar444._0_8_ = local_168.n[3];
      auVar262._8_8_ = 0;
      auVar262._0_8_ = local_108.n[4];
      auVar445._8_8_ = 0;
      auVar445._0_8_ = local_168.n[2];
      auVar2 = auVar260 * auVar443 + auVar517 + auVar261 * auVar444 + auVar262 * auVar445;
      uVar523 = auVar2._0_8_;
      auVar263._8_8_ = 0;
      auVar263._0_8_ = uVar523 & 0xfffffffffffff;
      auVar1 = auVar258 * auVar441 + auVar516 + auVar259 * auVar442 +
               auVar263 * ZEXT816(0x1000003d10);
      uVar527 = auVar1._0_8_;
      auVar519._8_8_ = 0;
      auVar519._0_8_ = uVar523 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar518._8_8_ = 0;
      auVar518._0_8_ = uVar527 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar264._8_8_ = 0;
      auVar264._0_8_ = local_108.n[0];
      auVar446._8_8_ = 0;
      auVar446._0_8_ = local_168.n[2];
      auVar265._8_8_ = 0;
      auVar265._0_8_ = local_108.n[1];
      auVar447._8_8_ = 0;
      auVar447._0_8_ = local_168.n[1];
      auVar266._8_8_ = 0;
      auVar266._0_8_ = local_108.n[2];
      auVar448._8_8_ = 0;
      auVar448._0_8_ = local_168.n[0];
      auVar267._8_8_ = 0;
      auVar267._0_8_ = local_108.n[3];
      auVar449._8_8_ = 0;
      auVar449._0_8_ = local_168.n[4];
      auVar268._8_8_ = 0;
      auVar268._0_8_ = local_108.n[4];
      auVar450._8_8_ = 0;
      auVar450._0_8_ = local_168.n[3];
      auVar2 = auVar267 * auVar449 + auVar519 + auVar268 * auVar450;
      uVar523 = auVar2._0_8_;
      auVar269._8_8_ = 0;
      auVar269._0_8_ = uVar523 & 0xfffffffffffff;
      auVar1 = auVar264 * auVar446 + auVar518 + auVar265 * auVar447 + auVar266 * auVar448 +
               auVar269 * ZEXT816(0x1000003d10);
      uVar522 = auVar1._0_8_;
      auVar520._8_8_ = 0;
      auVar520._0_8_ = (uVar522 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar528 & 0xfffffffffffff);
      auVar270._8_8_ = 0;
      auVar270._0_8_ = uVar523 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar520 = auVar270 * ZEXT816(0x1000003d10) + auVar520;
      uVar528 = auVar520._0_8_;
      xn->n[0] = 0x5ffff9ffffe91a - (local_198.n[0] + (uVar526 & 0xfffffffffffff));
      xn->n[1] = 0x5ffffffffffffa - (local_198.n[1] + (uVar527 & 0xfffffffffffff));
      xn->n[2] = 0x5ffffffffffffa - (local_198.n[2] + (uVar522 & 0xfffffffffffff));
      xn->n[3] = 0x5ffffffffffffa - (local_198.n[3] + (uVar528 & 0xfffffffffffff));
      xn->n[4] = 0x5fffffffffffa -
                 (local_198.n[4] +
                 (uVar528 >> 0x34 | auVar520._8_8_ << 0xc) + (uVar525 & 0xffffffffffff));
      return;
    }
    xn->n[4] = local_198.n[4];
    local_140 = xn;
    local_a8.n[0] = local_198.n[0];
    local_a8.n[1] = local_198.n[1];
    local_a8.n[2] = local_198.n[2];
    local_a8.n[3] = local_198.n[3];
  }
  else {
    xn->n[4] = local_198.n[4];
    xn->n[2] = local_198.n[2];
    xn->n[3] = local_198.n[3];
    xn->n[0] = local_198.n[0];
    xn->n[1] = local_198.n[1];
    local_140->n[4] = local_a8.n[4];
  }
  local_140->n[2] = local_a8.n[2];
  local_140->n[3] = local_a8.n[3];
  local_140->n[0] = local_a8.n[0];
  local_140->n[1] = local_a8.n[1];
  return;
}

Assistant:

static void secp256k1_ellswift_xswiftec_frac_var(secp256k1_fe *xn, secp256k1_fe *xd, const secp256k1_fe *u, const secp256k1_fe *t) {
    /* The implemented algorithm is the following (all operations in GF(p)):
     *
     * - Let c0 = sqrt(-3) = 0xa2d2ba93507f1df233770c2a797962cc61f6d15da14ecd47d8d27ae1cd5f852.
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - If u^3+7+t^2 = 0, set t = 2*t.
     * - Let X = (u^3+7-t^2)/(2*t).
     * - Let Y = (X+t)/(c0*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = (X/Y-u)/2 (which is now guaranteed to be a valid x coordinate).
     *
     * Introducing s=t^2, g=u^3+7, and simplifying x1=-(x2+u) we get:
     *
     * - Let c0 = ...
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - Let s = t^2
     * - Let g = u^3+7
     * - If g+s = 0, set t = 2*t, s = 4*s
     * - Let X = (g-s)/(2*t).
     * - Let Y = (X+t)/(c0*u) = (g+s)/(2*c0*t*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Now substitute Y^2 = -(g+s)^2/(12*s*u^2) and X/Y = c0*u*(g-s)/(g+s). This
     * means X and Y do not need to be evaluated explicitly anymore.
     *
     * - ...
     * - If g+s = 0, set s = 4*s.
     * - If x3 = u-(g+s)^2/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = (-c0*u*(g-s)/(g+s)-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Simplifying x2 using 2 additional constants:
     *
     * - Let c1 = (c0-1)/2 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = (-c0-1)/2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - ...
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - ...
     *
     * Writing x3 as a fraction:
     *
     * - ...
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) ...
     * - ...

     * Overall, we get:
     *
     * - Let c1 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - If u = 0, set u = 1.
     * - If t = 0, set s = 1, else set s = t^2.
     * - Let g = u^3+7.
     * - If g+s = 0, set s = 4*s.
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     */
    secp256k1_fe u1, s, g, p, d, n, l;
    u1 = *u;
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&u1), 0)) u1 = secp256k1_fe_one;
    secp256k1_fe_sqr(&s, t);
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(t), 0)) s = secp256k1_fe_one;
    secp256k1_fe_sqr(&l, &u1);                                   /* l = u^2 */
    secp256k1_fe_mul(&g, &l, &u1);                               /* g = u^3 */
    secp256k1_fe_add_int(&g, SECP256K1_B);                       /* g = u^3 + 7 */
    p = g;                                                       /* p = g */
    secp256k1_fe_add(&p, &s);                                    /* p = g+s */
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&p), 0)) {
        secp256k1_fe_mul_int(&s, 4);
        /* Recompute p = g+s */
        p = g;                                                   /* p = g */
        secp256k1_fe_add(&p, &s);                                /* p = g+s */
    }
    secp256k1_fe_mul(&d, &s, &l);                                /* d = s*u^2 */
    secp256k1_fe_mul_int(&d, 3);                                 /* d = 3*s*u^2 */
    secp256k1_fe_sqr(&l, &p);                                    /* l = (g+s)^2 */
    secp256k1_fe_negate(&l, &l, 1);                              /* l = -(g+s)^2 */
    secp256k1_fe_mul(&n, &d, &u1);                               /* n = 3*s*u^3 */
    secp256k1_fe_add(&n, &l);                                    /* n = 3*s*u^3-(g+s)^2 */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &d)) {
        /* Return x3 = n/d = (3*s*u^3-(g+s)^2)/(3*s*u^2) */
        *xn = n;
        *xd = d;
        return;
    }
    *xd = p;
    secp256k1_fe_mul(&l, &secp256k1_ellswift_c1, &s);            /* l = c1*s */
    secp256k1_fe_mul(&n, &secp256k1_ellswift_c2, &g);            /* n = c2*g */
    secp256k1_fe_add(&n, &l);                                    /* n = c1*s+c2*g */
    secp256k1_fe_mul(&n, &n, &u1);                               /* n = u*(c1*s+c2*g) */
    /* Possible optimization: in the invocation below, p^2 = (g+s)^2 is computed,
     * which we already have computed above. This could be deduplicated. */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &p)) {
        /* Return x2 = n/p = u*(c1*s+c2*g)/(g+s) */
        *xn = n;
        return;
    }
    secp256k1_fe_mul(&l, &p, &u1);                               /* l = u*(g+s) */
    secp256k1_fe_add(&n, &l);                                    /* n = u*(c1*s+c2*g)+u*(g+s) */
    secp256k1_fe_negate(xn, &n, 2);                              /* n = -u*(c1*s+c2*g)-u*(g+s) */
#ifdef VERIFY
    VERIFY_CHECK(secp256k1_ge_x_frac_on_curve_var(xn, &p));
#endif
    /* Return x3 = n/p = -(u*(c1*s+c2*g)/(g+s)+u) */
}